

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O3

int it_xm_read_pattern(IT_PATTERN *pattern,DUMBFILE *f,int n_channels,uchar *buffer,int version)

{
  byte bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint uVar31;
  int iVar32;
  int iVar33;
  int32 iVar34;
  IT_ENTRY *entry;
  byte bVar35;
  uchar uVar36;
  byte bVar37;
  int iVar38;
  ulong uVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  uint effect;
  int iVar43;
  int iVar44;
  undefined1 auVar45 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  uint local_3c;
  
  uVar31 = dumbfile_igetl(f);
  iVar41 = -1;
  if ((uVar31 == (version == 0x102 ^ 9)) && (iVar32 = dumbfile_getc(f), iVar32 == 0)) {
    if (version == 0x102) {
      iVar32 = dumbfile_getc(f);
      iVar32 = iVar32 + 1;
    }
    else {
      iVar32 = dumbfile_igetw(f);
    }
    pattern->n_rows = iVar32;
    iVar32 = dumbfile_igetw(f);
    pattern->n_entries = 0;
    iVar33 = dumbfile_error(f);
    if (iVar33 == 0) {
      if (iVar32 == 0) {
        iVar41 = 0;
      }
      else if ((iVar32 == n_channels * 0x500 ||
                SBORROW4(iVar32,n_channels * 0x500) != iVar32 + n_channels * -0x500 < 0) &&
              (iVar34 = dumbfile_getnc((char *)buffer,iVar32,f), iVar32 <= iVar34)) {
        pattern->n_entries = 0;
        if (iVar32 < 1) {
          iVar33 = 0;
          iVar38 = 0;
        }
        else {
          iVar33 = 0;
          iVar38 = 0;
          iVar42 = 0;
          iVar43 = 0;
          do {
            iVar42 = iVar42 + 1;
            bVar2 = n_channels <= iVar42;
            if (n_channels <= iVar42) {
              iVar42 = 0;
            }
            iVar33 = iVar33 + (uint)bVar2 + 1;
            pattern->n_entries = iVar33;
            iVar44 = 5;
            if ((char)buffer[iVar43] < '\0') {
              iVar44 = ""[buffer[iVar43] & 0x1f] + 1;
            }
            iVar38 = iVar38 + (uint)bVar2;
            iVar43 = iVar43 + iVar44;
          } while (iVar43 < iVar32);
        }
        iVar42 = pattern->n_rows;
        if (iVar38 <= iVar42) {
          if (iVar38 < iVar42) {
            iVar33 = (iVar33 + iVar42) - iVar38;
            pattern->n_entries = iVar33;
          }
          entry = (IT_ENTRY *)malloc((long)iVar33 * 7);
          pattern->entry = entry;
          if (entry != (IT_ENTRY *)0x0) {
            iVar41 = 0;
            if (iVar32 < 1) {
              local_3c = 0;
            }
            else {
              local_3c = 0;
              iVar33 = 0;
              iVar38 = 0;
              do {
                bVar37 = buffer[iVar38];
                bVar35 = bVar37 & 0x1f;
                iVar38 = iVar38 + (uint)(bVar37 >> 7);
                if (-1 < (char)bVar37) {
                  bVar35 = 0x1f;
                }
                if (bVar35 != 0) {
                  entry->channel = (uchar)iVar33;
                  entry->mask = '\0';
                  if ((bVar35 & 1) == 0) {
                    bVar37 = 0;
                  }
                  else {
                    lVar40 = (long)iVar38;
                    iVar38 = iVar38 + 1;
                    uVar36 = buffer[lVar40] + 0xff;
                    if (buffer[lVar40] == 'a') {
                      uVar36 = 0xff;
                    }
                    entry->note = uVar36;
                    entry->mask = '\x01';
                    bVar37 = 1;
                  }
                  if ((bVar35 & 2) != 0) {
                    lVar40 = (long)iVar38;
                    iVar38 = iVar38 + 1;
                    entry->instrument = buffer[lVar40];
                    bVar37 = bVar37 | 2;
                    entry->mask = bVar37;
                  }
                  if ((bVar35 & 4) != 0) {
                    lVar40 = (long)iVar38;
                    iVar38 = iVar38 + 1;
                    bVar1 = buffer[lVar40];
                    entry->mask = bVar37 + 4;
                    entry->volpan = bVar1;
                    if (((0xffdeU >> (bVar1 >> 4) & 1) == 0) &&
                       ((bVar1 >> 4 == 0 || (bVar1 != 0x50)))) {
                      entry->mask = bVar37;
                    }
                  }
                  uVar31 = 0;
                  if ((bVar35 & 8) == 0) {
                    effect = 0;
                  }
                  else {
                    lVar40 = (long)iVar38;
                    iVar38 = iVar38 + 1;
                    effect = (uint)buffer[lVar40];
                  }
                  if (0xf < bVar35) {
                    lVar40 = (long)iVar38;
                    iVar38 = iVar38 + 1;
                    uVar31 = (uint)buffer[lVar40];
                  }
                  _dumb_it_xm_convert_effect(effect,uVar31,entry,0);
                  entry = entry + 1;
                }
                iVar33 = iVar33 + 1;
                if (n_channels <= iVar33) {
                  local_3c = local_3c + 1;
                  entry->channel = 0xff;
                  entry = entry + 1;
                  iVar33 = 0;
                }
              } while (iVar38 < iVar32);
              iVar42 = pattern->n_rows;
            }
            auVar30 = _DAT_0073c3e0;
            auVar29 = _DAT_0073c3d0;
            auVar28 = _DAT_0073c1a0;
            auVar27 = _DAT_0073c190;
            auVar26 = _DAT_0073c180;
            auVar25 = _DAT_0073b300;
            auVar24 = _DAT_0073b2f0;
            if ((int)local_3c < iVar42) {
              uVar31 = iVar42 + ~local_3c;
              auVar45._4_4_ = 0;
              auVar45._0_4_ = uVar31;
              auVar45._8_4_ = uVar31;
              auVar45._12_4_ = 0;
              uVar39 = 0;
              iVar41 = 0;
              do {
                auVar63._8_4_ = (int)uVar39;
                auVar63._0_8_ = uVar39;
                auVar63._12_4_ = (int)(uVar39 >> 0x20);
                auVar65 = auVar45 ^ auVar25;
                auVar67 = (auVar63 | auVar24) ^ auVar25;
                iVar32 = auVar65._0_4_;
                iVar43 = -(uint)(iVar32 < auVar67._0_4_);
                iVar33 = auVar65._4_4_;
                auVar69._4_4_ = -(uint)(iVar33 < auVar67._4_4_);
                iVar38 = auVar65._8_4_;
                iVar44 = -(uint)(iVar38 < auVar67._8_4_);
                iVar42 = auVar65._12_4_;
                auVar69._12_4_ = -(uint)(iVar42 < auVar67._12_4_);
                auVar46._4_4_ = iVar43;
                auVar46._0_4_ = iVar43;
                auVar46._8_4_ = iVar44;
                auVar46._12_4_ = iVar44;
                auVar46 = pshuflw(in_XMM1,auVar46,0xe8);
                auVar68._4_4_ = -(uint)(auVar67._4_4_ == iVar33);
                auVar68._12_4_ = -(uint)(auVar67._12_4_ == iVar42);
                auVar68._0_4_ = auVar68._4_4_;
                auVar68._8_4_ = auVar68._12_4_;
                auVar55 = pshuflw(in_XMM2,auVar68,0xe8);
                auVar69._0_4_ = auVar69._4_4_;
                auVar69._8_4_ = auVar69._12_4_;
                auVar67 = pshuflw(auVar46,auVar69,0xe8);
                auVar65._8_4_ = 0xffffffff;
                auVar65._0_8_ = 0xffffffffffffffff;
                auVar65._12_4_ = 0xffffffff;
                auVar65 = (auVar67 | auVar55 & auVar46) ^ auVar65;
                auVar65 = packssdw(auVar65,auVar65);
                if ((auVar65 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  entry->channel = 0xff;
                }
                auVar55._4_4_ = iVar43;
                auVar55._0_4_ = iVar43;
                auVar55._8_4_ = iVar44;
                auVar55._12_4_ = iVar44;
                auVar69 = auVar68 & auVar55 | auVar69;
                auVar65 = packssdw(auVar69,auVar69);
                auVar67._8_4_ = 0xffffffff;
                auVar67._0_8_ = 0xffffffffffffffff;
                auVar67._12_4_ = 0xffffffff;
                auVar65 = packssdw(auVar65 ^ auVar67,auVar65 ^ auVar67);
                auVar65 = packsswb(auVar65,auVar65);
                if ((auVar65._0_4_ >> 8 & 1) != 0) {
                  entry[1].channel = 0xff;
                }
                auVar65 = (auVar63 | auVar28) ^ auVar25;
                auVar56._0_4_ = -(uint)(iVar32 < auVar65._0_4_);
                auVar56._4_4_ = -(uint)(iVar33 < auVar65._4_4_);
                auVar56._8_4_ = -(uint)(iVar38 < auVar65._8_4_);
                auVar56._12_4_ = -(uint)(iVar42 < auVar65._12_4_);
                auVar70._4_4_ = auVar56._0_4_;
                auVar70._0_4_ = auVar56._0_4_;
                auVar70._8_4_ = auVar56._8_4_;
                auVar70._12_4_ = auVar56._8_4_;
                iVar43 = -(uint)(auVar65._4_4_ == iVar33);
                iVar44 = -(uint)(auVar65._12_4_ == iVar42);
                auVar12._4_4_ = iVar43;
                auVar12._0_4_ = iVar43;
                auVar12._8_4_ = iVar44;
                auVar12._12_4_ = iVar44;
                auVar80._4_4_ = auVar56._4_4_;
                auVar80._0_4_ = auVar56._4_4_;
                auVar80._8_4_ = auVar56._12_4_;
                auVar80._12_4_ = auVar56._12_4_;
                auVar65 = auVar12 & auVar70 | auVar80;
                auVar65 = packssdw(auVar65,auVar65);
                auVar3._8_4_ = 0xffffffff;
                auVar3._0_8_ = 0xffffffffffffffff;
                auVar3._12_4_ = 0xffffffff;
                auVar65 = packssdw(auVar65 ^ auVar3,auVar65 ^ auVar3);
                auVar65 = packsswb(auVar65,auVar65);
                if ((auVar65._0_4_ >> 0x10 & 1) != 0) {
                  entry[2].channel = 0xff;
                }
                auVar65 = pshufhw(auVar65,auVar70,0x84);
                auVar13._4_4_ = iVar43;
                auVar13._0_4_ = iVar43;
                auVar13._8_4_ = iVar44;
                auVar13._12_4_ = iVar44;
                auVar67 = pshufhw(auVar56,auVar13,0x84);
                auVar46 = pshufhw(auVar65,auVar80,0x84);
                auVar47._8_4_ = 0xffffffff;
                auVar47._0_8_ = 0xffffffffffffffff;
                auVar47._12_4_ = 0xffffffff;
                auVar47 = (auVar46 | auVar67 & auVar65) ^ auVar47;
                auVar65 = packssdw(auVar47,auVar47);
                auVar65 = packsswb(auVar65,auVar65);
                if ((auVar65._0_4_ >> 0x18 & 1) != 0) {
                  entry[3].channel = 0xff;
                }
                auVar65 = (auVar63 | auVar27) ^ auVar25;
                auVar57._0_4_ = -(uint)(iVar32 < auVar65._0_4_);
                auVar57._4_4_ = -(uint)(iVar33 < auVar65._4_4_);
                auVar57._8_4_ = -(uint)(iVar38 < auVar65._8_4_);
                auVar57._12_4_ = -(uint)(iVar42 < auVar65._12_4_);
                auVar14._4_4_ = auVar57._0_4_;
                auVar14._0_4_ = auVar57._0_4_;
                auVar14._8_4_ = auVar57._8_4_;
                auVar14._12_4_ = auVar57._8_4_;
                auVar67 = pshuflw(auVar80,auVar14,0xe8);
                auVar48._0_4_ = -(uint)(auVar65._0_4_ == iVar32);
                auVar48._4_4_ = -(uint)(auVar65._4_4_ == iVar33);
                auVar48._8_4_ = -(uint)(auVar65._8_4_ == iVar38);
                auVar48._12_4_ = -(uint)(auVar65._12_4_ == iVar42);
                auVar71._4_4_ = auVar48._4_4_;
                auVar71._0_4_ = auVar48._4_4_;
                auVar71._8_4_ = auVar48._12_4_;
                auVar71._12_4_ = auVar48._12_4_;
                auVar65 = pshuflw(auVar48,auVar71,0xe8);
                auVar72._4_4_ = auVar57._4_4_;
                auVar72._0_4_ = auVar57._4_4_;
                auVar72._8_4_ = auVar57._12_4_;
                auVar72._12_4_ = auVar57._12_4_;
                auVar46 = pshuflw(auVar57,auVar72,0xe8);
                auVar4._8_4_ = 0xffffffff;
                auVar4._0_8_ = 0xffffffffffffffff;
                auVar4._12_4_ = 0xffffffff;
                auVar65 = packssdw(auVar65 & auVar67,(auVar46 | auVar65 & auVar67) ^ auVar4);
                auVar65 = packsswb(auVar65,auVar65);
                if ((auVar65 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  entry[4].channel = 0xff;
                }
                auVar15._4_4_ = auVar57._0_4_;
                auVar15._0_4_ = auVar57._0_4_;
                auVar15._8_4_ = auVar57._8_4_;
                auVar15._12_4_ = auVar57._8_4_;
                auVar72 = auVar71 & auVar15 | auVar72;
                auVar46 = packssdw(auVar72,auVar72);
                auVar5._8_4_ = 0xffffffff;
                auVar5._0_8_ = 0xffffffffffffffff;
                auVar5._12_4_ = 0xffffffff;
                auVar65 = packssdw(auVar65,auVar46 ^ auVar5);
                auVar65 = packsswb(auVar65,auVar65);
                if ((auVar65._4_2_ >> 8 & 1) != 0) {
                  entry[5].channel = 0xff;
                }
                auVar65 = (auVar63 | auVar26) ^ auVar25;
                auVar58._0_4_ = -(uint)(iVar32 < auVar65._0_4_);
                auVar58._4_4_ = -(uint)(iVar33 < auVar65._4_4_);
                auVar58._8_4_ = -(uint)(iVar38 < auVar65._8_4_);
                auVar58._12_4_ = -(uint)(iVar42 < auVar65._12_4_);
                auVar73._4_4_ = auVar58._0_4_;
                auVar73._0_4_ = auVar58._0_4_;
                auVar73._8_4_ = auVar58._8_4_;
                auVar73._12_4_ = auVar58._8_4_;
                iVar43 = -(uint)(auVar65._4_4_ == iVar33);
                iVar44 = -(uint)(auVar65._12_4_ == iVar42);
                auVar16._4_4_ = iVar43;
                auVar16._0_4_ = iVar43;
                auVar16._8_4_ = iVar44;
                auVar16._12_4_ = iVar44;
                auVar81._4_4_ = auVar58._4_4_;
                auVar81._0_4_ = auVar58._4_4_;
                auVar81._8_4_ = auVar58._12_4_;
                auVar81._12_4_ = auVar58._12_4_;
                auVar65 = auVar16 & auVar73 | auVar81;
                auVar65 = packssdw(auVar65,auVar65);
                auVar6._8_4_ = 0xffffffff;
                auVar6._0_8_ = 0xffffffffffffffff;
                auVar6._12_4_ = 0xffffffff;
                auVar65 = packssdw(auVar65 ^ auVar6,auVar65 ^ auVar6);
                auVar65 = packsswb(auVar65,auVar65);
                if ((auVar65 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  entry[6].channel = 0xff;
                }
                auVar65 = pshufhw(auVar65,auVar73,0x84);
                auVar17._4_4_ = iVar43;
                auVar17._0_4_ = iVar43;
                auVar17._8_4_ = iVar44;
                auVar17._12_4_ = iVar44;
                auVar67 = pshufhw(auVar58,auVar17,0x84);
                auVar46 = pshufhw(auVar65,auVar81,0x84);
                auVar49._8_4_ = 0xffffffff;
                auVar49._0_8_ = 0xffffffffffffffff;
                auVar49._12_4_ = 0xffffffff;
                auVar49 = (auVar46 | auVar67 & auVar65) ^ auVar49;
                auVar65 = packssdw(auVar49,auVar49);
                auVar65 = packsswb(auVar65,auVar65);
                if ((auVar65._6_2_ >> 8 & 1) != 0) {
                  entry[7].channel = 0xff;
                }
                auVar65 = (auVar63 | auVar30) ^ auVar25;
                auVar59._0_4_ = -(uint)(iVar32 < auVar65._0_4_);
                auVar59._4_4_ = -(uint)(iVar33 < auVar65._4_4_);
                auVar59._8_4_ = -(uint)(iVar38 < auVar65._8_4_);
                auVar59._12_4_ = -(uint)(iVar42 < auVar65._12_4_);
                auVar18._4_4_ = auVar59._0_4_;
                auVar18._0_4_ = auVar59._0_4_;
                auVar18._8_4_ = auVar59._8_4_;
                auVar18._12_4_ = auVar59._8_4_;
                auVar67 = pshuflw(auVar81,auVar18,0xe8);
                auVar50._0_4_ = -(uint)(auVar65._0_4_ == iVar32);
                auVar50._4_4_ = -(uint)(auVar65._4_4_ == iVar33);
                auVar50._8_4_ = -(uint)(auVar65._8_4_ == iVar38);
                auVar50._12_4_ = -(uint)(auVar65._12_4_ == iVar42);
                auVar74._4_4_ = auVar50._4_4_;
                auVar74._0_4_ = auVar50._4_4_;
                auVar74._8_4_ = auVar50._12_4_;
                auVar74._12_4_ = auVar50._12_4_;
                auVar65 = pshuflw(auVar50,auVar74,0xe8);
                auVar75._4_4_ = auVar59._4_4_;
                auVar75._0_4_ = auVar59._4_4_;
                auVar75._8_4_ = auVar59._12_4_;
                auVar75._12_4_ = auVar59._12_4_;
                auVar46 = pshuflw(auVar59,auVar75,0xe8);
                auVar60._8_4_ = 0xffffffff;
                auVar60._0_8_ = 0xffffffffffffffff;
                auVar60._12_4_ = 0xffffffff;
                auVar60 = (auVar46 | auVar65 & auVar67) ^ auVar60;
                auVar46 = packssdw(auVar60,auVar60);
                auVar65 = packsswb(auVar65 & auVar67,auVar46);
                if ((auVar65 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  entry[8].channel = 0xff;
                }
                auVar19._4_4_ = auVar59._0_4_;
                auVar19._0_4_ = auVar59._0_4_;
                auVar19._8_4_ = auVar59._8_4_;
                auVar19._12_4_ = auVar59._8_4_;
                auVar75 = auVar74 & auVar19 | auVar75;
                auVar46 = packssdw(auVar75,auVar75);
                auVar7._8_4_ = 0xffffffff;
                auVar7._0_8_ = 0xffffffffffffffff;
                auVar7._12_4_ = 0xffffffff;
                auVar46 = packssdw(auVar46 ^ auVar7,auVar46 ^ auVar7);
                auVar65 = packsswb(auVar65,auVar46);
                if ((auVar65._8_2_ >> 8 & 1) != 0) {
                  entry[9].channel = 0xff;
                }
                auVar65 = (auVar63 | auVar29) ^ auVar25;
                auVar61._0_4_ = -(uint)(iVar32 < auVar65._0_4_);
                auVar61._4_4_ = -(uint)(iVar33 < auVar65._4_4_);
                auVar61._8_4_ = -(uint)(iVar38 < auVar65._8_4_);
                auVar61._12_4_ = -(uint)(iVar42 < auVar65._12_4_);
                auVar76._4_4_ = auVar61._0_4_;
                auVar76._0_4_ = auVar61._0_4_;
                auVar76._8_4_ = auVar61._8_4_;
                auVar76._12_4_ = auVar61._8_4_;
                iVar43 = -(uint)(auVar65._4_4_ == iVar33);
                iVar44 = -(uint)(auVar65._12_4_ == iVar42);
                auVar20._4_4_ = iVar43;
                auVar20._0_4_ = iVar43;
                auVar20._8_4_ = iVar44;
                auVar20._12_4_ = iVar44;
                auVar82._4_4_ = auVar61._4_4_;
                auVar82._0_4_ = auVar61._4_4_;
                auVar82._8_4_ = auVar61._12_4_;
                auVar82._12_4_ = auVar61._12_4_;
                auVar65 = auVar20 & auVar76 | auVar82;
                auVar65 = packssdw(auVar65,auVar65);
                auVar8._8_4_ = 0xffffffff;
                auVar8._0_8_ = 0xffffffffffffffff;
                auVar8._12_4_ = 0xffffffff;
                auVar65 = packssdw(auVar65 ^ auVar8,auVar65 ^ auVar8);
                auVar65 = packsswb(auVar65,auVar65);
                if ((auVar65 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  entry[10].channel = 0xff;
                }
                auVar65 = pshufhw(auVar65,auVar76,0x84);
                auVar21._4_4_ = iVar43;
                auVar21._0_4_ = iVar43;
                auVar21._8_4_ = iVar44;
                auVar21._12_4_ = iVar44;
                auVar67 = pshufhw(auVar61,auVar21,0x84);
                auVar46 = pshufhw(auVar65,auVar82,0x84);
                auVar51._8_4_ = 0xffffffff;
                auVar51._0_8_ = 0xffffffffffffffff;
                auVar51._12_4_ = 0xffffffff;
                auVar51 = (auVar46 | auVar67 & auVar65) ^ auVar51;
                auVar65 = packssdw(auVar51,auVar51);
                auVar65 = packsswb(auVar65,auVar65);
                if ((auVar65._10_2_ >> 8 & 1) != 0) {
                  entry[0xb].channel = 0xff;
                }
                auVar65 = (auVar63 | _DAT_0073c3c0) ^ auVar25;
                auVar62._0_4_ = -(uint)(iVar32 < auVar65._0_4_);
                auVar62._4_4_ = -(uint)(iVar33 < auVar65._4_4_);
                auVar62._8_4_ = -(uint)(iVar38 < auVar65._8_4_);
                auVar62._12_4_ = -(uint)(iVar42 < auVar65._12_4_);
                auVar22._4_4_ = auVar62._0_4_;
                auVar22._0_4_ = auVar62._0_4_;
                auVar22._8_4_ = auVar62._8_4_;
                auVar22._12_4_ = auVar62._8_4_;
                auVar67 = pshuflw(auVar82,auVar22,0xe8);
                auVar52._0_4_ = -(uint)(auVar65._0_4_ == iVar32);
                auVar52._4_4_ = -(uint)(auVar65._4_4_ == iVar33);
                auVar52._8_4_ = -(uint)(auVar65._8_4_ == iVar38);
                auVar52._12_4_ = -(uint)(auVar65._12_4_ == iVar42);
                auVar77._4_4_ = auVar52._4_4_;
                auVar77._0_4_ = auVar52._4_4_;
                auVar77._8_4_ = auVar52._12_4_;
                auVar77._12_4_ = auVar52._12_4_;
                auVar65 = pshuflw(auVar52,auVar77,0xe8);
                auVar78._4_4_ = auVar62._4_4_;
                auVar78._0_4_ = auVar62._4_4_;
                auVar78._8_4_ = auVar62._12_4_;
                auVar78._12_4_ = auVar62._12_4_;
                auVar46 = pshuflw(auVar62,auVar78,0xe8);
                auVar9._8_4_ = 0xffffffff;
                auVar9._0_8_ = 0xffffffffffffffff;
                auVar9._12_4_ = 0xffffffff;
                auVar65 = packssdw(auVar65 & auVar67,(auVar46 | auVar65 & auVar67) ^ auVar9);
                auVar65 = packsswb(auVar65,auVar65);
                if ((auVar65 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  entry[0xc].channel = 0xff;
                }
                auVar23._4_4_ = auVar62._0_4_;
                auVar23._0_4_ = auVar62._0_4_;
                auVar23._8_4_ = auVar62._8_4_;
                auVar23._12_4_ = auVar62._8_4_;
                auVar78 = auVar77 & auVar23 | auVar78;
                auVar46 = packssdw(auVar78,auVar78);
                auVar10._8_4_ = 0xffffffff;
                auVar10._0_8_ = 0xffffffffffffffff;
                auVar10._12_4_ = 0xffffffff;
                auVar65 = packssdw(auVar65,auVar46 ^ auVar10);
                auVar65 = packsswb(auVar65,auVar65);
                if ((auVar65._12_2_ >> 8 & 1) != 0) {
                  entry[0xd].channel = 0xff;
                }
                auVar65 = (auVar63 | _DAT_0073c3b0) ^ auVar25;
                auVar53._0_4_ = -(uint)(iVar32 < auVar65._0_4_);
                auVar53._4_4_ = -(uint)(iVar33 < auVar65._4_4_);
                auVar53._8_4_ = -(uint)(iVar38 < auVar65._8_4_);
                auVar53._12_4_ = -(uint)(iVar42 < auVar65._12_4_);
                auVar79._4_4_ = auVar53._0_4_;
                auVar79._0_4_ = auVar53._0_4_;
                auVar79._8_4_ = auVar53._8_4_;
                auVar79._12_4_ = auVar53._8_4_;
                auVar64._4_4_ = -(uint)(auVar65._4_4_ == iVar33);
                auVar64._12_4_ = -(uint)(auVar65._12_4_ == iVar42);
                auVar64._0_4_ = auVar64._4_4_;
                auVar64._8_4_ = auVar64._12_4_;
                auVar66._4_4_ = auVar53._4_4_;
                auVar66._0_4_ = auVar53._4_4_;
                auVar66._8_4_ = auVar53._12_4_;
                auVar66._12_4_ = auVar53._12_4_;
                auVar46 = auVar64 & auVar79 | auVar66;
                auVar65 = packssdw(auVar53,auVar46);
                auVar11._8_4_ = 0xffffffff;
                auVar11._0_8_ = 0xffffffffffffffff;
                auVar11._12_4_ = 0xffffffff;
                auVar65 = packssdw(auVar65 ^ auVar11,auVar65 ^ auVar11);
                auVar65 = packsswb(auVar65,auVar65);
                if ((auVar65 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  entry[0xe].channel = 0xff;
                }
                auVar65 = pshufhw(auVar65,auVar79,0x84);
                in_XMM2 = pshufhw(auVar46,auVar64,0x84);
                in_XMM2 = in_XMM2 & auVar65;
                auVar65 = pshufhw(auVar65,auVar66,0x84);
                auVar54._8_4_ = 0xffffffff;
                auVar54._0_8_ = 0xffffffffffffffff;
                auVar54._12_4_ = 0xffffffff;
                auVar54 = (auVar65 | in_XMM2) ^ auVar54;
                auVar65 = packssdw(auVar54,auVar54);
                in_XMM1 = packsswb(auVar65,auVar65);
                if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                  entry[0xf].channel = 0xff;
                }
                uVar39 = uVar39 + 0x10;
                entry = entry + 0x10;
              } while (((ulong)uVar31 + 0x10 & 0xfffffffffffffff0) != uVar39);
            }
          }
        }
      }
    }
  }
  return iVar41;
}

Assistant:

static int it_xm_read_pattern(IT_PATTERN *pattern, DUMBFILE *f, int n_channels, unsigned char *buffer, int version)
{
	int size;
	int pos;
	int channel;
	int row;
	int effect, effectvalue;
	IT_ENTRY *entry;

	/* pattern header size */
	if (dumbfile_igetl(f) != ( version == 0x0102 ? 0x08 : 0x09 ) ) {
		TRACE("XM error: unexpected pattern header size\n");
		return -1;
	}

	/* pattern data packing type */
	if (dumbfile_getc(f) != 0) {
		TRACE("XM error: unexpected pattern packing type\n");
		return -1;
	}

	if ( version == 0x0102 )
		pattern->n_rows = dumbfile_getc(f) + 1;
	else
		pattern->n_rows = dumbfile_igetw(f);  /* 1..256 */
	size = dumbfile_igetw(f);
	pattern->n_entries = 0;

	if (dumbfile_error(f))
		return -1;

	if (size == 0)
		return 0;

	if (size > 1280 * n_channels) {
		TRACE("XM error: pattern data size > %d bytes\n", 1280 * n_channels);
		return -1;
	}

    if (dumbfile_getnc((char *)buffer, size, f) < size)
		return -1;

	/* compute number of entries */
	pattern->n_entries = 0;
	pos = channel = row = 0;
	while (pos < size) {
		if (!(buffer[pos] & XM_ENTRY_PACKED) || (buffer[pos] & 31))
			pattern->n_entries++;

		channel++;
		if (channel >= n_channels) {
			channel = 0;
			row++;
			pattern->n_entries++;
		}

		if (buffer[pos] & XM_ENTRY_PACKED) {
			static const char offset[] = { 0, 1, 1, 2, 1, 2, 2, 3,   1, 2, 2, 3, 2, 3, 3, 4,
			                               1, 2, 2, 3, 2, 3, 3, 4,   2, 3, 3, 4, 3, 4, 4, 5 };
			pos += 1 + offset[buffer[pos] & 31];
		} else {
			pos += 5;
		}
	}

	if (row > pattern->n_rows) {
		TRACE("XM error: wrong number of rows in pattern data\n");
		return -1;
	}

	/* Whoops, looks like some modules may be short, a few channels, maybe even rows... */

	while (row < pattern->n_rows)
	{
		pattern->n_entries++;
		row++;
	}

	pattern->entry = malloc(pattern->n_entries * sizeof(*pattern->entry));
	if (!pattern->entry)
		return -1;

	/* read the entries */
	entry = pattern->entry;
	pos = channel = row = 0;
	while (pos < size) {
		unsigned char mask;

		if (buffer[pos] & XM_ENTRY_PACKED)
			mask = buffer[pos++] & 31;
		else
			mask = 31;

		if (mask) {
			ASSERT(entry < pattern->entry + pattern->n_entries);

			entry->channel = channel;
			entry->mask = 0;

			if (mask & XM_ENTRY_NOTE) {
				int note = buffer[pos++]; /* 1-96 <=> C0-B7 */
				entry->note = (note == XM_NOTE_OFF) ? (IT_NOTE_OFF) : (note-1);
				entry->mask |= IT_ENTRY_NOTE;
			}

			if (mask & XM_ENTRY_INSTRUMENT) {
				entry->instrument = buffer[pos++]; /* 1-128 */
				entry->mask |= IT_ENTRY_INSTRUMENT;
			}

			if (mask & XM_ENTRY_VOLUME)
				it_xm_convert_volume(buffer[pos++], entry);

			effect = effectvalue = 0;
			if (mask & XM_ENTRY_EFFECT)      effect = buffer[pos++];
			if (mask & XM_ENTRY_EFFECTVALUE) effectvalue = buffer[pos++];
			_dumb_it_xm_convert_effect(effect, effectvalue, entry, 0);

			entry++;
		}

		channel++;
		if (channel >= n_channels) {
			channel = 0;
			row++;
			IT_SET_END_ROW(entry);
			entry++;
		}
	}

	while (row < pattern->n_rows)
	{
		row++;
		IT_SET_END_ROW(entry);
		entry++;
	}

	return 0;
}